

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O1

StackPage * __thiscall Lodtalk::StackMemory::allocatePage(StackMemory *this)

{
  pointer *pppSVar1;
  iterator __position;
  pointer ppSVar2;
  StackPage *pSVar3;
  StackPage *in_RAX;
  StackPage *local_18;
  
  local_18 = in_RAX;
  if ((this->freePages).
      super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->freePages).
      super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pSVar3 = this->currentPage;
    do {
      local_18 = pSVar3;
      pSVar3 = local_18->previousPage;
    } while (local_18->previousPage != (StackPage *)0x0);
    StackPage::divorceAllFrames(local_18);
    __position._M_current =
         (this->freePages).
         super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->freePages).
        super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Lodtalk::StackPage*,std::allocator<Lodtalk::StackPage*>>::
      _M_realloc_insert<Lodtalk::StackPage*const&>
                ((vector<Lodtalk::StackPage*,std::allocator<Lodtalk::StackPage*>> *)&this->freePages
                 ,__position,&local_18);
    }
    else {
      *__position._M_current = local_18;
      pppSVar1 = &(this->freePages).
                  super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppSVar1 = *pppSVar1 + 1;
    }
  }
  ppSVar2 = (this->freePages).
            super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->freePages).
      super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppSVar2) {
    pSVar3 = ppSVar2[-1];
    (this->freePages).
    super__Vector_base<Lodtalk::StackPage_*,_std::allocator<Lodtalk::StackPage_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppSVar2 + -1;
    pSVar3->previousPage = (StackPage *)0x0;
    pSVar3->nextPage = (StackPage *)0x0;
    return pSVar3;
  }
  __assert_fail("!freePages.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0xca,"StackPage *Lodtalk::StackMemory::allocatePage()");
}

Assistant:

StackPage *StackMemory::allocatePage()
{
    StackPage *page = nullptr;
    if (freePages.empty())
    {
        // Find the least used page
        auto leastUsed = currentPage;
        for (; leastUsed->previousPage; leastUsed = leastUsed->previousPage)
            ;

        leastUsed->divorceAllFrames();
        freePages.push_back(leastUsed);
   }

    assert(!freePages.empty());
    page = freePages.back();
    freePages.pop_back();

    page->previousPage = nullptr;
    page->nextPage = nullptr;
    return page;
}